

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void roaring_bitmap_printf(roaring_bitmap_t *r)

{
  int *in_RDI;
  int i;
  roaring_array_t *ra;
  uint32_t in_stack_ffffffffffffffe8;
  int iVar1;
  
  printf("{");
  for (iVar1 = 0; iVar1 < *in_RDI; iVar1 = iVar1 + 1) {
    container_printf_as_uint32_array
              (in_RDI,(uint8_t)((uint)iVar1 >> 0x18),in_stack_ffffffffffffffe8);
    if (iVar1 + 1 < *in_RDI) {
      printf(",");
    }
  }
  printf("}");
  return;
}

Assistant:

void roaring_bitmap_printf(const roaring_bitmap_t *r) {
    const roaring_array_t *ra = &r->high_low_container;

    printf("{");
    for (int i = 0; i < ra->size; ++i) {
        container_printf_as_uint32_array(ra->containers[i], ra->typecodes[i],
                                         ((uint32_t)ra->keys[i]) << 16);

        if (i + 1 < ra->size) {
            printf(",");
        }
    }
    printf("}");
}